

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild.cpp
# Opt level: O2

double __thiscall FNodeBuilder::InterceptVector(FNodeBuilder *this,node_t *splitter,FPrivSeg *seg)

{
  undefined4 uVar1;
  undefined4 uVar3;
  FSimpleVert FVar2;
  FPrivVert *pFVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  pFVar4 = (this->Vertices).Array;
  uVar1 = splitter->dx;
  uVar3 = splitter->dy;
  FVar2 = pFVar4[seg->v1].super_FSimpleVert;
  dVar6 = (double)FVar2.x;
  dVar7 = (double)FVar2.y;
  FVar2 = pFVar4[seg->v2].super_FSimpleVert;
  dVar5 = ((double)FVar2.x - dVar6) * (double)(int)uVar3 -
          ((double)FVar2.y - dVar7) * (double)(int)uVar1;
  if ((dVar5 == 0.0) && (!NAN(dVar5))) {
    return 0.0;
  }
  return (((double)splitter->x - dVar6) * (double)(int)uVar3 +
         (dVar7 - (double)splitter->y) * (double)(int)uVar1) / dVar5;
}

Assistant:

double FNodeBuilder::InterceptVector (const node_t &splitter, const FPrivSeg &seg)
{
	double v2x = (double)Vertices[seg.v1].x;
	double v2y = (double)Vertices[seg.v1].y;
	double v2dx = (double)Vertices[seg.v2].x - v2x;
	double v2dy = (double)Vertices[seg.v2].y - v2y;
	double v1dx = (double)splitter.dx;
	double v1dy = (double)splitter.dy;

	double den = v1dy*v2dx - v1dx*v2dy;

	if (den == 0.0)
		return 0;		// parallel

	double v1x = (double)splitter.x;
	double v1y = (double)splitter.y;

	double num = (v1x - v2x)*v1dy + (v2y - v1y)*v1dx;
	double frac = num / den;

	return frac;
}